

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O1

Path * tinyusdz::pathutil::FromString(Path *__return_storage_ptr__,string *_path_str)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  string path_str;
  string prim_part;
  string prop_part;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (_path_str->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + _path_str->_M_string_length);
  if ((local_90._M_string_length == 0) ||
     (iVar2 = ::std::__cxx11::string::compare((char *)&local_90), iVar2 == 0)) {
LAB_001fa7e8:
    (__return_storage_ptr__->_prim_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_prim_part).field_2;
    (__return_storage_ptr__->_prim_part)._M_string_length = 0;
    (__return_storage_ptr__->_prim_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_prop_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_prop_part).field_2;
    (__return_storage_ptr__->_prop_part)._M_string_length = 0;
    (__return_storage_ptr__->_prop_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_part).field_2;
    (__return_storage_ptr__->_variant_part)._M_string_length = 0;
    (__return_storage_ptr__->_variant_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_selection_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_selection_part).field_2;
    (__return_storage_ptr__->_variant_selection_part)._M_string_length = 0;
    (__return_storage_ptr__->_variant_selection_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_part_str)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_part_str).field_2;
    (__return_storage_ptr__->_variant_part_str)._M_string_length = 0;
    (__return_storage_ptr__->_variant_part_str).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_element)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_element).field_2;
    (__return_storage_ptr__->_element)._M_string_length = 0;
    (__return_storage_ptr__->_element).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_path_type).has_value_ = false;
    (__return_storage_ptr__->_path_type).contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    __return_storage_ptr__->_valid = false;
  }
  else {
    uVar3 = ::std::__cxx11::string::find_last_of((char *)&local_90,0x42d1da,0xffffffffffffffff);
    if (uVar3 == 0xffffffffffffffff) {
LAB_001fa8b8:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      Path::Path(__return_storage_ptr__,&local_90,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001fa871;
    }
    else {
      if (uVar3 == local_90._M_string_length - 1) goto LAB_001fa7e8;
      if ((uVar3 < local_90._M_string_length - 1 && 1 < local_90._M_string_length) &&
         (local_90._M_dataplus._M_p[uVar3 + 1] == '/')) goto LAB_001fa8b8;
      ::std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_90);
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_90);
      Path::Path(__return_storage_ptr__,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001fa871;
    }
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_001fa871:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Path FromString(const std::string &_path_str) {

  std::string path_str = _path_str;

  if (path_str.empty()) {
    return Path();
  }

  if (path_str == ".") {
    // invalid
    return Path();
  }

  size_t loc = path_str.find_last_of(".");
  if (loc != std::string::npos) {
    if (loc == (path_str.size() - 1)) {
      // ends with "."
      return Path();
    } else if ((path_str.size() > 1) && (loc < (path_str.size() - 1))) {
      if (path_str[loc+1] == '/') {
        // guess relative prim path only.
        return Path(path_str, "");
      }
    }
  }

  if (loc == std::string::npos) {
    // prim_part only
    return Path(path_str, "");
  }

  std::string prim_part = path_str.substr(0, loc);
  std::string prop_part = path_str.substr(loc+1);

  return Path(prim_part, prop_part);
}